

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

shared_ptr<const_SyntaxTree> hint_from(optional<const_SyntaxTree_&> *cmdnode,value_type *arg)

{
  bool bVar1;
  variant<const_SyntaxTree_*,_int,_float> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<const_SyntaxTree> sVar3;
  optional<const_SyntaxTree_&> local_28;
  variant<const_SyntaxTree_*,_int,_float> *local_20;
  value_type *arg_local;
  optional<const_SyntaxTree_&> *cmdnode_local;
  
  local_20 = in_RDX;
  arg_local = arg;
  cmdnode_local = cmdnode;
  bVar1 = is<SyntaxTree_const*,eggs::variants::variant<SyntaxTree_const*,int,float>>(in_RDX);
  if (bVar1) {
    eggs::variants::get<SyntaxTree_const*,SyntaxTree_const*,int,float,0ul>(local_20);
    sVar3 = std::enable_shared_from_this<SyntaxTree>::shared_from_this
                      ((enable_shared_from_this<SyntaxTree> *)cmdnode);
    _Var2 = sVar3.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  else {
    std::experimental::optional<const_SyntaxTree_&>::optional
              (&local_28,(optional<const_SyntaxTree_&> *)arg);
    sVar3 = hint_from(cmdnode);
    _Var2 = sVar3.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  sVar3.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)cmdnode;
  return (shared_ptr<const_SyntaxTree>)
         sVar3.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto hint_from(optional<const SyntaxTree&> cmdnode, const Commands::MatchArgumentList::value_type& arg) -> shared_ptr<const SyntaxTree>
{
    if(is<const SyntaxTree*>(arg))
        return get<const SyntaxTree*>(arg)->shared_from_this();
    return hint_from(cmdnode);
}